

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataControllerDefault.cpp
# Opt level: O1

void __thiscall Rml::DataControllerValue::ProcessEvent(DataControllerValue *this)

{
  Event *in_RSI;
  
  ProcessEvent((DataControllerValue *)
               &this[-1].address.
                super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
                _M_impl.super__Vector_impl_data._M_finish,in_RSI);
  return;
}

Assistant:

void DataControllerValue::ProcessEvent(Event& event)
{
	if (const Element* element = GetElement())
	{
		Variant value_to_set;
		const auto& parameters = event.GetParameters();
		const auto override_value_it = parameters.find("data-binding-override-value");
		const auto value_it = parameters.find("value");
		if (override_value_it != parameters.cend())
			value_to_set = override_value_it->second;
		else if (value_it != parameters.cend())
			value_to_set = value_it->second;
		else
			Log::Message(Log::LT_WARNING,
				"A 'change' event was received, but it did not contain the attribute 'value' when processing a data binding in %s",
				element->GetAddress().c_str());

		DataModel* model = element->GetDataModel();
		if (value_to_set.GetType() == Variant::NONE || !model)
			return;

		if (DataVariable variable = model->GetVariable(address))
			if (variable.Set(value_to_set))
				model->DirtyVariable(address.front().name);
	}
}